

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

char * __thiscall
cppcms::impl::url_rewriter::rule::rewrite_once(rule *this,cmatch *m,string_pool *pool)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  match_results<const_char_*> *in_RSI;
  long in_RDI;
  size_t i_1;
  char *ptr;
  char *new_url;
  size_t i;
  size_t total_size;
  sub_match<const_char_*> *in_stack_ffffffffffffff18;
  match_results<const_char_*> *in_stack_ffffffffffffff20;
  match_results<const_char_*> *__last;
  char *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  int n;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  char *local_80;
  char *local_58;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
    if (sVar1 <= local_28) break;
    in_stack_ffffffffffffff40._M_current = (char *)in_RSI;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),local_28);
    booster::match_results<const_char_*>::operator[]
              ((match_results<const_char_*> *)in_stack_ffffffffffffff40._M_current,
               (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    booster::sub_match<const_char_*>::length(in_stack_ffffffffffffff18);
    local_28 = local_28 + 1;
  }
  pcVar2 = string_pool::alloc((string_pool *)in_stack_ffffffffffffff20,
                              (size_t)in_stack_ffffffffffffff18);
  local_58 = (char *)0x0;
  while( true ) {
    __last_00._M_current = local_58;
    pcVar3 = (char *)std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
    if (pcVar3 <= __last_00._M_current) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8),(size_type)local_58);
    std::__cxx11::string::begin();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8),(size_type)local_58);
    std::__cxx11::string::end();
    std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
              (in_stack_ffffffffffffff40,__last_00,in_stack_ffffffffffffff30);
    n = (int)((ulong)__last_00._M_current >> 0x20);
    in_stack_ffffffffffffff20 = in_RSI;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)local_58);
    booster::match_results<const_char_*>::operator[]
              ((match_results<const_char_*> *)in_stack_ffffffffffffff40._M_current,n);
    __last = in_RSI;
    in_stack_ffffffffffffff30 = local_80;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(size_type)local_58);
    booster::match_results<const_char_*>::operator[]
              ((match_results<const_char_*> *)in_stack_ffffffffffffff40._M_current,n);
    std::copy<char_const*,char*>
              (in_stack_ffffffffffffff30,(char *)__last,(char *)in_stack_ffffffffffffff20);
    local_58 = local_58 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_ffffffffffffff20);
  std::__cxx11::string::begin();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_ffffffffffffff20);
  std::__cxx11::string::end();
  pcVar3 = std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                     (in_stack_ffffffffffffff40,__last_00,in_stack_ffffffffffffff30);
  *pcVar3 = '\0';
  return pcVar2;
}

Assistant:

char *rewrite_once(booster::cmatch const &m,string_pool &pool) const
		{
			size_t total_size = pattern_size;
			for(size_t i=0;i<index.size();i++) {
				total_size += m[index[i]].length();
			}
			char *new_url = pool.alloc(total_size+1);
			char *ptr = new_url;
			for(size_t i=0;i<index.size();i++) {
				ptr = std::copy(pattern[i].begin(),pattern[i].end(),ptr);
				ptr = std::copy(m[index[i]].first,m[index[i]].second,ptr);
			}
			ptr = std::copy(pattern.back().begin(),pattern.back().end(),ptr);
			*ptr = 0;
			return new_url;
		}